

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanMemoryPage::VulkanMemoryPage(VulkanMemoryPage *this,VulkanMemoryPage *rhs)

{
  this->m_ParentMemoryMgr = rhs->m_ParentMemoryMgr;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  Diligent::VariableSizeAllocationsManager::VariableSizeAllocationsManager
            (&this->m_AllocationMgr,&rhs->m_AllocationMgr);
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  VulkanObjectWrapper(&this->m_VkMemory,&rhs->m_VkMemory);
  this->m_CPUMemory = rhs->m_CPUMemory;
  rhs->m_CPUMemory = (void *)0x0;
  return;
}

Assistant:

VulkanMemoryPage(VulkanMemoryPage&& rhs)noexcept :
        m_ParentMemoryMgr {rhs.m_ParentMemoryMgr         },
        m_AllocationMgr   {std::move(rhs.m_AllocationMgr)},
        m_VkMemory        {std::move(rhs.m_VkMemory)     },
        m_CPUMemory       {rhs.m_CPUMemory               }
    {
        rhs.m_CPUMemory = nullptr;
    }